

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_glsl.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  GLuint shader;
  GLuint shader_00;
  GLuint GVar2;
  GLenum GVar3;
  GLFWwindow *handle;
  int iVar4;
  GLint stat;
  GLsizei len;
  GLchar log [1000];
  
  glfwInit();
  glfwWindowHint(0x20004,0);
  glfwWindowHint(0x22002,2);
  iVar4 = 1;
  glfwWindowHint(0x22003,1);
  handle = glfwCreateWindow(0xfa,0xfa,*argv,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    iVar4 = 0x7d;
  }
  else {
    glfwMakeContextCurrent(handle);
    iVar1 = gladLoadGLLoader(glfwGetProcAddress);
    if (iVar1 != 0) {
      if (GLAD_GL_VERSION_2_0 == 0) {
        puts("This program requires OpenGL 2.x");
        exit(0x7d);
      }
      shader = (*glad_glCreateShader)(0x8b30);
      LoadAndCompileShader(shader,"void main() {\n   gl_FragColor = gl_Color;\n}\n");
      shader_00 = (*glad_glCreateShader)(0x8b31);
      LoadAndCompileShader
                (shader_00,
                 "void main() {\n   gl_Position = gl_ModelViewProjectionMatrix * gl_Vertex;\n   gl_FrontColor = gl_Color;\n}\n"
                );
      GVar2 = (*glad_glCreateProgram)();
      (*glad_glAttachShader)(GVar2,shader);
      (*glad_glAttachShader)(GVar2,shader_00);
      (*glad_glLinkProgram)(GVar2);
      (*glad_glGetProgramiv)(GVar2,0x8b82,&stat);
      if (stat == 0) {
        (*glad_glGetProgramInfoLog)(GVar2,1000,&len,log);
        fprintf(_stderr,"Linker error:\n%s\n",log);
      }
      (*glad_glDetachShader)(GVar2,shader);
      (*glad_glDetachShader)(GVar2,shader_00);
      (*glad_glDeleteShader)(shader);
      (*glad_glDeleteShader)(shader_00);
      (*glad_glUseProgram)(GVar2);
      GVar3 = (*glad_glGetError)();
      if (GVar3 != 0) {
        __assert_fail("glGetError() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/apitrace[P]apitrace-tests/apps/gl/tri_glsl.cpp"
                      ,99,"void Init()");
      }
      (*glad_glClearColor)(0.3,0.1,0.3,1.0);
      glfwGetFramebufferSize(handle,(int *)log,&stat);
      iVar4 = 0;
      (*glad_glViewport)(0,0,log._0_4_,stat);
      (*glad_glMatrixMode)(0x1701);
      (*glad_glLoadIdentity)();
      (*glad_glOrtho)(-1.0,1.0,-1.0,1.0,-0.5,1000.0);
      (*glad_glMatrixMode)(0x1700);
      (*glad_glClear)(0x4000);
      (*glad_glBegin)(4);
      (*glad_glColor3f)(0.8,0.0,0.0);
      (*glad_glVertex3f)(-0.9,-0.9,-30.0);
      (*glad_glColor3f)(0.0,0.9,0.0);
      (*glad_glVertex3f)(0.9,-0.9,-30.0);
      (*glad_glColor3f)(0.0,0.0,0.7);
      (*glad_glVertex3f)(0.0,0.9,-30.0);
      (*glad_glEnd)();
      (*glad_glFlush)();
      glfwSwapBuffers(handle);
      (*glad_glDeleteProgram)(GVar2);
      glfwDestroyWindow(handle);
      glfwTerminate();
    }
  }
  return iVar4;
}

Assistant:

int
main(int argc, char **argv)
{
   glfwInit();

   glfwWindowHint(GLFW_VISIBLE, GL_FALSE);
   glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
   glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 1);

   window = glfwCreateWindow(250, 250, argv[0], NULL, NULL);
   if (!window) {
       return EXIT_SKIP;
   }

   glfwMakeContextCurrent(window);

   if (!gladLoadGLLoader((GLADloadproc) glfwGetProcAddress)) {
      return EXIT_FAILURE;
   }

   Init();
   Reshape();
   Draw();

   glDeleteProgram(program);

   glfwDestroyWindow(window);
   glfwTerminate();

   return 0;
}